

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_utils.cpp
# Opt level: O2

uint8_t * zmq_z85_decode(uint8_t *dest_,char *string_)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  sVar4 = strlen(string_);
  if ((4 < sVar4) && (sVar4 % 5 == 0)) {
    uVar6 = 0;
    iVar3 = 0;
    do {
      iVar9 = iVar3;
      uVar8 = 0;
      do {
        cVar1 = string_[uVar6];
        if (cVar1 == '\0') {
          if ((int)(uVar6 % 5) == 0) {
            return dest_;
          }
          goto LAB_0016d929;
        }
        if ((0x3030303 < uVar8) || (cVar1 < ' ')) goto LAB_0016d929;
        uVar7 = uVar8 * 0x55;
        bVar2 = decoder[(byte)(cVar1 - 0x20)];
        uVar8 = uVar7 + bVar2;
        if ((bVar2 == 0xff) || (CARRY4(uVar7,(uint)bVar2))) goto LAB_0016d929;
        uVar7 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar7;
      } while (uVar7 % 5 != 0);
      uVar10 = 0x1000000;
      for (iVar11 = 0; iVar3 = iVar9 + 4, iVar11 != 4; iVar11 = iVar11 + 1) {
        dest_[(uint)(iVar9 + iVar11)] = (uint8_t)(uVar8 / uVar10);
        uVar10 = uVar10 >> 8;
      }
    } while( true );
  }
LAB_0016d929:
  piVar5 = __errno_location();
  *piVar5 = 0x16;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *zmq_z85_decode (uint8_t *dest_, const char *string_)
{
    unsigned int byte_nbr = 0;
    unsigned int char_nbr = 0;
    uint32_t value = 0;
    size_t src_len = strlen (string_);

    if (src_len < 5 || src_len % 5 != 0)
        goto error_inval;

    while (string_[char_nbr]) {
        //  Accumulate value in base 85
        if (UINT32_MAX / 85 < value) {
            //  Invalid z85 encoding, represented value exceeds 0xffffffff
            goto error_inval;
        }
        value *= 85;
        const uint8_t index = string_[char_nbr++] - 32;
        if (index >= sizeof (decoder)) {
            //  Invalid z85 encoding, character outside range
            goto error_inval;
        }
        const uint32_t summand = decoder[index];
        if (summand == 0xFF || summand > (UINT32_MAX - value)) {
            //  Invalid z85 encoding, invalid character or represented value exceeds 0xffffffff
            goto error_inval;
        }
        value += summand;
        if (char_nbr % 5 == 0) {
            //  Output value in base 256
            unsigned int divisor = 256 * 256 * 256;
            while (divisor) {
                dest_[byte_nbr++] = value / divisor % 256;
                divisor /= 256;
            }
            value = 0;
        }
    }
    if (char_nbr % 5 != 0) {
        goto error_inval;
    }
    assert (byte_nbr == strlen (string_) * 4 / 5);
    return dest_;

error_inval:
    errno = EINVAL;
    return NULL;
}